

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_allgather_single(bsc_step_t depends,bsc_group_t group,void *src,void *dst,bsc_size_t size)

{
  undefined4 local_54;
  undefined4 local_4c;
  char *dst_bytes;
  bsc_pid_t P;
  bsc_pid_t i;
  group_t *g;
  bsc_size_t size_local;
  void *dst_local;
  void *src_local;
  bsc_group_t group_local;
  bsc_step_t depends_local;
  
  if (group == (bsc_group_t)0x0) {
    local_4c = bsp_nprocs();
  }
  else {
    local_4c = *group;
  }
  for (dst_bytes._4_4_ = 0; dst_bytes._4_4_ < local_4c; dst_bytes._4_4_ = dst_bytes._4_4_ + 1) {
    if (group == (bsc_group_t)0x0) {
      local_54 = dst_bytes._4_4_;
    }
    else {
      local_54 = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + (long)dst_bytes._4_4_ * 4);
    }
    bsc_get(depends,local_54,src,0,(void *)((long)dst + (long)(dst_bytes._4_4_ * size)),size);
  }
  return depends + 1;
}

Assistant:

bsc_step_t bsc_allgather_single( bsc_step_t depends, bsc_group_t group,
                        const void * src, void * dst, bsc_size_t size )
{
    const group_t * g = group;
    bsc_pid_t i, P = g?g->size:bsp_nprocs() ;
    for ( i = 0; i < P; ++i ) {
        char * dst_bytes = dst;
        bsc_get( depends, g?g->gid[i]:i, src, 0, dst_bytes + i * size, size );
    }
    return depends + 1;
}